

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall xLearn::MODEL_TEST_Save_and_Load_Test::TestBody(MODEL_TEST_Save_and_Load_Test *this)

{
  bool bVar1;
  index_t iVar2;
  index_t iVar3;
  real_t *prVar4;
  char *pcVar5;
  AssertionResult gtest_ar_12;
  int i_3;
  AssertionResult gtest_ar_11;
  int i_2;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  index_t param_num_v;
  index_t param_num_w;
  real_t *b;
  Model new_model;
  int i_1;
  index_t v_len;
  real_t *v;
  int i;
  index_t w_len;
  real_t *w;
  Model model_ffm;
  HyperParam hyper_param;
  HyperParam *in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  char *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  Model *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  Model *in_stack_fffffffffffffa50;
  AssertHelper local_550;
  Message local_548;
  AssertionResult local_540;
  uint local_52c;
  AssertHelper local_528;
  Message local_520;
  AssertionResult local_518;
  uint local_504;
  AssertHelper local_500;
  Message local_4f8;
  AssertionResult local_4f0;
  AssertHelper local_4e0;
  Message local_4d8;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  real_t local_4ac;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  index_t local_484;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  index_t local_45c;
  AssertionResult local_458;
  AssertHelper local_448;
  Message local_440;
  index_t local_434;
  AssertionResult local_430;
  AssertHelper local_420;
  Message local_418;
  AssertionResult local_410;
  AssertHelper local_400;
  Message local_3f8;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  index_t local_3d0;
  int local_3cc;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  AssertionResult local_388;
  int local_378;
  int local_374;
  real_t *local_370;
  float in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffcfc;
  real_t *in_stack_fffffffffffffd00;
  real_t *in_stack_fffffffffffffd08;
  uint local_2d8;
  uint local_2c8;
  Model local_2a8 [2];
  int local_160;
  int local_158;
  int local_154;
  real_t in_stack_ffffffffffffff00;
  index_t in_stack_ffffffffffffff04;
  index_t in_stack_ffffffffffffff08;
  index_t in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  Model *in_stack_ffffffffffffff20;
  index_t in_stack_ffffffffffffff30;
  
  Init();
  Model::Model((Model *)in_stack_fffffffffffff940);
  Model::Initialize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                    in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                    in_stack_ffffffffffffff30,in_stack_ffffffffffffff00);
  prVar4 = Model::GetParameter_w(local_2a8);
  iVar2 = Model::GetNumParameter_w(local_2a8);
  for (local_2c8 = 0; local_2c8 < iVar2; local_2c8 = local_2c8 + 1) {
    prVar4[(int)local_2c8] = 2.5;
  }
  prVar4 = Model::GetParameter_v(local_2a8);
  iVar2 = Model::GetNumParameter_v(local_2a8);
  for (local_2d8 = 0; local_2d8 < iVar2; local_2d8 = local_2d8 + 1) {
    prVar4[(int)local_2d8] = 3.5;
  }
  Model::Serialize(in_stack_fffffffffffffa30,
                   (string *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
  Model::Model(in_stack_fffffffffffffa50,
               (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  local_370 = Model::GetParameter_b((Model *)&stack0xfffffffffffffc98);
  Model::GetParameter_w((Model *)&stack0xfffffffffffffc98);
  iVar2 = Model::GetNumParameter_w((Model *)&stack0xfffffffffffffc98);
  Model::GetParameter_v((Model *)&stack0xfffffffffffffc98);
  iVar3 = Model::GetNumParameter_v((Model *)&stack0xfffffffffffffc98);
  local_374 = local_160 * 2;
  local_378 = local_160 * local_154 * local_158 * 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13f6b5);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x13f718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f76d);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    in_stack_fffffffffffffa50 =
         (Model *)testing::AssertionResult::failure_message((AssertionResult *)0x13f809);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb5,(char *)in_stack_fffffffffffffa50);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    testing::Message::~Message((Message *)0x13f86c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f8c4);
  local_3cc = local_378 + 2 + local_374;
  local_3d0 = Model::GetNumParameter((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13f9a1);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message((Message *)0x13fa04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fa5c);
  Model::GetScoreFunction_abi_cxx11_((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13fb1f);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    testing::Message::~Message((Message *)0x13fb82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fbda);
  Model::GetLossFunction_abi_cxx11_((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_410);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13fc9d);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message((Message *)0x13fd00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fd58);
  local_434 = Model::GetNumK((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13fe28);
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xb9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::Message::~Message((Message *)0x13fe8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13fee3);
  local_45c = Model::GetNumFeature((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x13ffb3);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message((Message *)0x140016);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14006e);
  local_484 = Model::GetNumField((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (uint *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x140132);
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    testing::Message::~Message((Message *)0x14018f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1401e7);
  local_4ac = Model::GetAuxiliarySize((Model *)&stack0xfffffffffffffc98);
  testing::internal::EqHelper<false>::Compare<unsigned_int,float>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,
             (uint *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
             (float *)in_stack_fffffffffffff940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1402ab);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    testing::Message::~Message((Message *)0x140308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14035d);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((char *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1403f3);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    testing::Message::~Message((Message *)0x140450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1404a5);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((char *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x140540);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0xbe,pcVar5);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    testing::Message::~Message((Message *)0x14059d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1405f5);
  for (local_504 = 0; local_504 < iVar2; local_504 = local_504 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((char *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
    if (!bVar1) {
      testing::Message::Message(&local_520);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1406b7);
      testing::internal::AssertHelper::AssertHelper
                (&local_528,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0xc0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_528,&local_520);
      testing::internal::AssertHelper::~AssertHelper(&local_528);
      testing::Message::~Message((Message *)0x140714);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x140769);
  }
  for (local_52c = 0; local_52c < iVar3; local_52c = local_52c + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((char *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_540);
    if (!bVar1) {
      testing::Message::Message(&local_548);
      in_stack_fffffffffffff940 =
           (HyperParam *)testing::AssertionResult::failure_message((AssertionResult *)0x140841);
      testing::internal::AssertHelper::AssertHelper
                (&local_550,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0xc3,(char *)in_stack_fffffffffffff940);
      testing::internal::AssertHelper::operator=(&local_550,&local_548);
      testing::internal::AssertHelper::~AssertHelper(&local_550);
      testing::Message::~Message((Message *)0x14089e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1408f3);
  }
  std::__cxx11::string::c_str();
  RemoveFile((char *)in_stack_fffffffffffffa50);
  Model::~Model((Model *)in_stack_fffffffffffff940);
  Model::~Model((Model *)in_stack_fffffffffffff940);
  HyperParam::~HyperParam(in_stack_fffffffffffff940);
  return;
}

Assistant:

TEST(MODEL_TEST, Save_and_Load) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size);
  real_t* w = model_ffm.GetParameter_w();
  index_t w_len = model_ffm.GetNumParameter_w();
  for (int i = 0; i < w_len; ++i) {
    w[i] = 2.5;
  }
  real_t* v = model_ffm.GetParameter_v();
  index_t v_len = model_ffm.GetNumParameter_v();
  for (int i = 0; i < v_len; ++i) {
    v[i] = 3.5;
  }
  model_ffm.Serialize(hyper_param.model_file);
  Model new_model(hyper_param.model_file);
  real_t* b = new_model.GetParameter_b();
  w = new_model.GetParameter_w();
  w_len = new_model.GetNumParameter_w();
  v = new_model.GetParameter_v();
  v_len = new_model.GetNumParameter_v();
  index_t param_num_w = hyper_param.num_feature * 2;
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(w_len, param_num_w);
  EXPECT_EQ(v_len, param_num_v);
  EXPECT_EQ(param_num_v+param_num_w+2, new_model.GetNumParameter());
  EXPECT_EQ(hyper_param.score_func, new_model.GetScoreFunction());
  EXPECT_EQ(hyper_param.loss_func, new_model.GetLossFunction());
  EXPECT_EQ(hyper_param.num_K, new_model.GetNumK());
  EXPECT_EQ(hyper_param.num_feature, new_model.GetNumFeature());
  EXPECT_EQ(hyper_param.num_field, new_model.GetNumField());
  EXPECT_EQ(hyper_param.auxiliary_size, new_model.GetAuxiliarySize());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  for (int i = 0; i < w_len; ++i) {
    EXPECT_FLOAT_EQ(w[i], 2.5);
  }
  for (int i = 0; i < v_len; ++i) {
    EXPECT_FLOAT_EQ(v[i], 3.5);
  }
  RemoveFile(hyper_param.model_file.c_str());
}